

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AggregationDB.cpp
# Opt level: O2

AggregateEntry * __thiscall
aggregate::AggregationDB::find_or_create_entry
          (AggregationDB *this,SnapshotView key,size_t hash,size_t num_aggr_attrs,bool can_alloc)

{
  vector<aggregate::AggregateEntry,_std::allocator<aggregate::AggregateEntry>_> *this_00;
  pointer puVar1;
  unsigned_long uVar2;
  pointer pEVar3;
  pointer pEVar4;
  pointer pAVar5;
  AggregateEntry *pAVar6;
  bool bVar7;
  size_t *psVar8;
  size_t sVar9;
  size_t sVar10;
  ulong uVar11;
  pointer pAVar12;
  long lVar13;
  ulong uVar14;
  Entry *__first;
  ulong __new_size;
  AggregateEntry e;
  
  sVar10 = key.m_len;
  __first = key.m_data;
  puVar1 = (this->m_hashmap).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar11 = hash % (ulong)((long)(this->m_hashmap).
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3);
  this_00 = &this->m_entries;
  uVar14 = 1;
  psVar8 = puVar1 + uVar11;
  while (uVar2 = *psVar8, uVar2 != 0) {
    pAVar12 = (this_00->
              super__Vector_base<aggregate::AggregateEntry,_std::allocator<aggregate::AggregateEntry>_>
              )._M_impl.super__Vector_impl_data._M_start;
    if (pAVar12[uVar2].key_len == sVar10) {
      bVar7 = std::__equal<false>::equal<cali::Entry_const*,cali::Entry*>
                        (__first,__first + sVar10,
                         (this->m_keyents).
                         super__Vector_base<cali::Entry,_std::allocator<cali::Entry>_>._M_impl.
                         super__Vector_impl_data._M_start + pAVar12[uVar2].key_idx);
      if (bVar7) {
        return pAVar12 + uVar2;
      }
      pAVar12 = (this_00->
                super__Vector_base<aggregate::AggregateEntry,_std::allocator<aggregate::AggregateEntry>_>
                )._M_impl.super__Vector_impl_data._M_start;
    }
    uVar14 = uVar14 + 1;
    psVar8 = &pAVar12[uVar2].next_entry_idx;
  }
  if (can_alloc) {
    sVar9 = ((long)(this->m_kernels).
                   super__Vector_base<aggregate::AggregateKernel,_std::allocator<aggregate::AggregateKernel>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->m_kernels).
                  super__Vector_base<aggregate::AggregateKernel,_std::allocator<aggregate::AggregateKernel>_>
                  ._M_impl.super__Vector_impl_data._M_start) / 0x38;
    __new_size = sVar9 + num_aggr_attrs;
  }
  else {
    pAVar5 = (this->m_kernels).
             super__Vector_base<aggregate::AggregateKernel,_std::allocator<aggregate::AggregateKernel>_>
             ._M_impl.super__Vector_impl_data._M_start;
    sVar9 = ((long)(this->m_kernels).
                   super__Vector_base<aggregate::AggregateKernel,_std::allocator<aggregate::AggregateKernel>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar5) / 0x38;
    __new_size = sVar9 + num_aggr_attrs;
    if (((ulong)(((long)(this->m_kernels).
                        super__Vector_base<aggregate::AggregateKernel,_std::allocator<aggregate::AggregateKernel>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pAVar5) / 0x38)
         <= __new_size) ||
       (pEVar3 = (this->m_keyents).super__Vector_base<cali::Entry,_std::allocator<cali::Entry>_>.
                 _M_impl.super__Vector_impl_data._M_start,
       (ulong)(((long)(this->m_keyents).
                      super__Vector_base<cali::Entry,_std::allocator<cali::Entry>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage - (long)pEVar3) / 0x18) <=
       ((long)(this->m_keyents).super__Vector_base<cali::Entry,_std::allocator<cali::Entry>_>.
              _M_impl.super__Vector_impl_data._M_finish - (long)pEVar3) / 0x18 + sVar10)) {
      return (this_00->
             super__Vector_base<aggregate::AggregateEntry,_std::allocator<aggregate::AggregateEntry>_>
             )._M_impl.super__Vector_impl_data._M_start;
    }
    pAVar6 = (this->m_entries).
             super__Vector_base<aggregate::AggregateEntry,_std::allocator<aggregate::AggregateEntry>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->m_entries).
                       super__Vector_base<aggregate::AggregateEntry,_std::allocator<aggregate::AggregateEntry>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pAVar6) / 0x30) <=
        ((long)(this->m_entries).
               super__Vector_base<aggregate::AggregateEntry,_std::allocator<aggregate::AggregateEntry>_>
               ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar6) / 0x30 + 1U) {
      return pAVar6;
    }
  }
  e.num_kernels = 0;
  e.next_entry_idx = 0;
  e.key_len = 0;
  e.kernels_idx = 0;
  e.count = 0;
  e.key_idx = 0;
  std::vector<aggregate::AggregateKernel,_std::allocator<aggregate::AggregateKernel>_>::resize
            (&this->m_kernels,__new_size,(value_type *)&e);
  pEVar3 = (this->m_keyents).super__Vector_base<cali::Entry,_std::allocator<cali::Entry>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pEVar4 = (this->m_keyents).super__Vector_base<cali::Entry,_std::allocator<cali::Entry>_>._M_impl.
           super__Vector_impl_data._M_start;
  std::__copy_move<false,false,std::random_access_iterator_tag>::
  __copy_m<cali::Entry_const*,std::back_insert_iterator<std::vector<cali::Entry,std::allocator<cali::Entry>>>>
            (__first,__first + sVar10,
             (back_insert_iterator<std::vector<cali::Entry,_std::allocator<cali::Entry>_>_>)
             &this->m_keyents);
  e.count = 0;
  e.next_entry_idx =
       (this->m_hashmap).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start[uVar11];
  lVar13 = (long)(this->m_entries).
                 super__Vector_base<aggregate::AggregateEntry,_std::allocator<aggregate::AggregateEntry>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->m_entries).
                 super__Vector_base<aggregate::AggregateEntry,_std::allocator<aggregate::AggregateEntry>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  e.key_idx = ((long)pEVar3 - (long)pEVar4) / 0x18;
  e.key_len = sVar10;
  e.kernels_idx = sVar9;
  e.num_kernels = num_aggr_attrs;
  std::vector<aggregate::AggregateEntry,_std::allocator<aggregate::AggregateEntry>_>::push_back
            (this_00,&e);
  (this->m_hashmap).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[uVar11] = lVar13 / 0x30;
  if (uVar14 < this->m_max_hash_len) {
    uVar14 = this->m_max_hash_len;
  }
  this->m_max_hash_len = uVar14;
  return (AggregateEntry *)
         (lVar13 + (long)(this->m_entries).
                         super__Vector_base<aggregate::AggregateEntry,_std::allocator<aggregate::AggregateEntry>_>
                         ._M_impl.super__Vector_impl_data._M_start);
}

Assistant:

AggregateEntry* AggregationDB::find_or_create_entry(SnapshotView key, std::size_t hash, std::size_t num_aggr_attrs, bool can_alloc)
{
    hash           = hash % m_hashmap.size();
    size_t key_len = key.size();
    size_t count   = 0;

    for (std::size_t idx = m_hashmap[hash]; idx != 0; idx = m_entries[idx].next_entry_idx) {
        AggregateEntry* e = &m_entries[idx];
        if (key_len == e->key_len && std::equal(key.begin(), key.end(), m_keyents.begin() + e->key_idx))
            return e;
        ++count;
    }

    // --- entry not found, check if we can create a new entry
    //

    if (!can_alloc) {
        if (m_kernels.size() + num_aggr_attrs >= m_kernels.capacity())
            return &m_entries[0];
        if (m_keyents.size() + key_len >= m_keyents.capacity())
            return &m_entries[0];
        if (m_entries.size() + 1 >= m_entries.capacity())
            return &m_entries[0];
    }

    size_t kernels_idx = m_kernels.size();
    m_kernels.resize(m_kernels.size() + num_aggr_attrs, AggregateKernel());

    size_t key_idx = m_keyents.size();
    std::copy(key.begin(), key.end(), std::back_inserter(m_keyents));

    AggregateEntry e;

    e.count          = 0;
    e.key_idx        = key_idx;
    e.key_len        = key_len;
    e.kernels_idx    = kernels_idx;
    e.num_kernels    = num_aggr_attrs;
    e.next_entry_idx = m_hashmap[hash];

    size_t entry_idx = m_entries.size();
    m_entries.push_back(e);
    m_hashmap[hash] = entry_idx;

    m_max_hash_len = std::max(m_max_hash_len, count + 1);

    return &m_entries[entry_idx];
}